

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::PrintInitExpr(BinaryReaderObjdump *this,InitExpr *expr)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_type sVar6;
  const_pointer pcVar7;
  undefined1 local_88 [8];
  string_view name_1;
  string_view name;
  char buffer_1 [20];
  char local_48 [8];
  char buffer [40];
  InitExpr *expr_local;
  BinaryReaderObjdump *this_local;
  
  switch(expr->type) {
  case I32:
    PrintDetails(this," - init i32=%d\n",(ulong)(expr->value).index);
    break;
  case F32:
    WriteFloatHex((char *)&name.size_,0x14,(expr->value).i32);
    PrintDetails(this," - init f32=%s\n",&name.size_);
    break;
  case I64:
    PrintDetails(this," - init i64=%ld\n",(expr->value).i64);
    break;
  case F64:
    WriteDoubleHex(local_48,0x28,(expr->value).i64);
    PrintDetails(this," - init f64=%s\n",local_48);
    break;
  case V128:
    uVar2 = v128::u32(&(expr->value).v128_v,0);
    uVar3 = v128::u32(&(expr->value).v128_v,1);
    uVar4 = v128::u32(&(expr->value).v128_v,2);
    uVar5 = v128::u32(&(expr->value).v128_v,3);
    PrintDetails(this," - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",(ulong)uVar2,(ulong)uVar3,
                 (ulong)uVar4,(ulong)uVar5);
    break;
  case Global:
    PrintDetails(this," - init global=%u",(ulong)(expr->value).index);
    join_0x00000010_0x00000000_ =
         BinaryReaderObjdumpBase::GetGlobalName
                   (&this->super_BinaryReaderObjdumpBase,(expr->value).index);
    bVar1 = string_view::empty((string_view *)&name_1.size_);
    if (!bVar1) {
      sVar6 = string_view::length((string_view *)&name_1.size_);
      pcVar7 = string_view::data((string_view *)&name_1.size_);
      PrintDetails(this," <%.*s>",sVar6 & 0xffffffff,pcVar7);
    }
    PrintDetails(this,"\n");
    break;
  case FuncRef:
    PrintDetails(this," - init ref.func:%u",(ulong)(expr->value).index);
    _local_88 = BinaryReaderObjdumpBase::GetFunctionName
                          (&this->super_BinaryReaderObjdumpBase,(expr->value).index);
    bVar1 = string_view::empty((string_view *)local_88);
    if (!bVar1) {
      sVar6 = string_view::length((string_view *)local_88);
      pcVar7 = string_view::data((string_view *)local_88);
      PrintDetails(this," <%.*s>",sVar6 & 0xffffffff,pcVar7);
    }
    PrintDetails(this,"\n");
    break;
  case NullRef:
    PrintDetails(this," - init nullref\n");
  }
  return;
}

Assistant:

void BinaryReaderObjdump::PrintInitExpr(const InitExpr& expr) {
  switch (expr.type) {
    case InitExprType::I32:
      PrintDetails(" - init i32=%d\n", expr.value.i32);
      break;
    case InitExprType::I64:
      PrintDetails(" - init i64=%" PRId64 "\n", expr.value.i64);
      break;
    case InitExprType::F64: {
      char buffer[WABT_MAX_DOUBLE_HEX];
      WriteDoubleHex(buffer, sizeof(buffer), expr.value.f64);
      PrintDetails(" - init f64=%s\n", buffer);
      break;
    }
    case InitExprType::F32: {
      char buffer[WABT_MAX_FLOAT_HEX];
      WriteFloatHex(buffer, sizeof(buffer), expr.value.f32);
      PrintDetails(" - init f32=%s\n", buffer);
      break;
    }
    case InitExprType::V128: {
      PrintDetails(" - init v128=0x%08x 0x%08x 0x%08x 0x%08x \n",
                   expr.value.v128_v.u32(0), expr.value.v128_v.u32(1),
                   expr.value.v128_v.u32(2), expr.value.v128_v.u32(3));
      break;
    }
    case InitExprType::Global: {
      PrintDetails(" - init global=%" PRIindex, expr.value.index);
      string_view name = GetGlobalName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::FuncRef: {
      PrintDetails(" - init ref.func:%" PRIindex, expr.value.index);
      string_view name = GetFunctionName(expr.value.index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      PrintDetails("\n");
      break;
    }
    case InitExprType::NullRef: {
      PrintDetails(" - init nullref\n");
      break;
    }
  }
}